

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

PolymorphicEmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitLoop(WasmBytecodeGenerator *this)

{
  bool bVar1;
  uint uVar2;
  WasmReaderBase *pWVar3;
  RegisterSpace *this_00;
  PolymorphicEmitInfo PVar4;
  RegSlot local_60;
  uint32 loopId;
  uint32 minYield;
  Types type;
  RegSlot curRegs [5];
  BlockInfo *local_38;
  BlockInfo *implicitBlockInfo;
  uint local_28;
  ByteCodeLabel loopLandingPadLabel;
  ByteCodeLabel loopHeadLabel;
  ByteCodeLabel loopTailLabel;
  WasmBytecodeGenerator *this_local;
  PolymorphicEmitInfo loopInfo;
  
  _loopHeadLabel = this;
  loopLandingPadLabel = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  local_28 = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  implicitBlockInfo._4_4_ = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  pWVar3 = GetReader(this);
  unique0x00012000 = (pWVar3->m_currentNode).field_1.block;
  local_38 = PushLabel(this,unique0x00012000,loopLandingPadLabel,true,true);
  for (loopId = 0; loopId != 5; loopId = loopId + 1) {
    local_60 = 0;
    bVar1 = WAsmJs::TypedRegisterAllocator::IsTypeExcluded(&this->mTypedRegisterAllocator,loopId);
    if (!bVar1) {
      this_00 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                          (&this->mTypedRegisterAllocator,loopId);
      local_60 = WAsmJs::RegisterSpace::PeekNextTmpRegister(this_00);
    }
    (&minYield)[loopId] = local_60;
  }
  uVar2 = (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1d])
                    (this->m_writer,(ulong)local_28,&minYield);
  JsUtil::Stack<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
            (&this->m_blockInfos);
  pWVar3 = GetReader(this);
  PushLabel(this,(pWVar3->m_currentNode).field_1.block,implicitBlockInfo._4_4_,false,true);
  EmitBlockCommon(this,local_38,(bool *)0x0);
  PopLabel(this,implicitBlockInfo._4_4_);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])
            (this->m_writer,(ulong)(uint)loopLandingPadLabel);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)implicitBlockInfo._4_4_);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])(this->m_writer,(ulong)local_28,0x25);
  JsUtil::Stack<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Push
            (&this->m_blockInfos,&local_38);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)(uint)loopLandingPadLabel);
  PVar4 = PopLabel(this,loopLandingPadLabel);
  loopInfo._0_8_ = PVar4.field_1;
  this_local._0_4_ = PVar4.count;
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1e])(this->m_writer,(ulong)uVar2);
  PVar4._4_4_ = 0;
  PVar4.count = (uint32)this_local;
  PVar4.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)loopInfo._0_8_;
  return PVar4;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitLoop()
{
    Js::ByteCodeLabel loopTailLabel = m_writer->DefineLabel();
    Js::ByteCodeLabel loopHeadLabel = m_writer->DefineLabel();
    Js::ByteCodeLabel loopLandingPadLabel = m_writer->DefineLabel();

    // Push possibly yielding loop label before capturing all the yielding registers
    BlockInfo* implicitBlockInfo = PushLabel(GetReader()->m_currentNode.block, loopTailLabel);

    // Save the first tmp (per type) of this loop to discern a yield outside the loop in jitloopbody scenario
    Js::RegSlot curRegs[WAsmJs::LIMIT];
    for (WAsmJs::Types type = WAsmJs::Types(0); type != WAsmJs::LIMIT; type = WAsmJs::Types(type + 1))
    {
        uint32 minYield = 0;
        if (!mTypedRegisterAllocator.IsTypeExcluded(type))
        {
            CompileAssert(sizeof(minYield) == sizeof(Js::RegSlot));
            minYield = static_cast<uint32>(mTypedRegisterAllocator.GetRegisterSpace(type)->PeekNextTmpRegister());
        }
        curRegs[type] = minYield;
    }
    uint32 loopId = m_writer->WasmLoopStart(loopHeadLabel, curRegs);

    // Internally we create a block for loop to exit, but semantically, they don't exist so pop it
    m_blockInfos.Pop();

    // We don't want nested block to jump directly to the loop header
    // instead, jump to the landing pad and let it jump back to the loop header
    PushLabel(GetReader()->m_currentNode.block, loopLandingPadLabel, false);
    EmitBlockCommon(implicitBlockInfo);
    PopLabel(loopLandingPadLabel);

    // By default we don't loop, jump over the landing pad
    m_writer->AsmBr(loopTailLabel);
    m_writer->MarkAsmJsLabel(loopLandingPadLabel);
    m_writer->AsmBr(loopHeadLabel);

    // Put the implicit block back on the stack and yield the last expression to it
    m_blockInfos.Push(implicitBlockInfo);
    m_writer->MarkAsmJsLabel(loopTailLabel);
    // Pop the implicit block to resolve the yield correctly
    PolymorphicEmitInfo loopInfo = PopLabel(loopTailLabel);
    m_writer->ExitLoop(loopId);

    return loopInfo;
}